

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

DBGPROP_ATTRIB_FLAGS __thiscall
Js::RecyclableObjectDisplay::GetTypeAttribute(RecyclableObjectDisplay *this)

{
  uint uVar1;
  Type TVar2;
  JavascriptString *pJVar3;
  Var pvVar4;
  ScriptContext *scriptContext;
  code *pcVar5;
  bool bVar6;
  BOOL BVar7;
  JavascriptString *pJVar8;
  undefined4 *puVar9;
  RecyclableObject *pRVar10;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  anon_class_16_2_3fdfe927 checkWriteableFunction;
  DBGPROP_ATTRIB_FLAGS flag;
  
  uVar1 = this->defaultAttributes;
  checkWriteableFunction.flag._4_4_ = uVar1;
  bVar6 = VarIs<Js::RecyclableObject>(this->instance);
  if (!bVar6) goto LAB_007ebc34;
  pJVar3 = (JavascriptString *)this->instance;
  pJVar8 = JavascriptLibrary::GetDebuggerDeadZoneBlockVariableString
                     ((this->scriptContext->super_ScriptContextBase).javascriptLibrary);
  if (pJVar3 == pJVar8) {
    checkWriteableFunction.flag._4_4_ = uVar1 | 8;
    goto LAB_007ebc34;
  }
  pvVar4 = this->instance;
  if (pvVar4 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar6) goto LAB_007ebd36;
    *puVar9 = 0;
  }
  bVar6 = TaggedInt::Is(pvVar4);
  if ((ulong)pvVar4 >> 0x32 == 0 && !bVar6) {
    pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar4);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar6) goto LAB_007ebd36;
      *puVar9 = 0;
    }
    TVar2 = ((pRVar10->type).ptr)->typeId;
    if ((int)TVar2 < 0x58) {
      if (TVar2 == TypeIds_Function) {
        checkWriteableFunction.flag._4_4_ = uVar1 | 0x100;
        goto LAB_007ebc34;
      }
    }
    else {
      BVar7 = RecyclableObject::IsExternal(pRVar10);
      if (BVar7 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar6) goto LAB_007ebd36;
        *puVar9 = 0;
      }
    }
  }
  pvVar4 = this->instance;
  if (pvVar4 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar6) goto LAB_007ebd36;
    *puVar9 = 0;
  }
  bVar6 = TaggedInt::Is(pvVar4);
  if ((Var)0x3ffffffffffff < pvVar4 || bVar6) {
LAB_007ebb4a:
    pvVar4 = this->instance;
    if (pvVar4 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar6) goto LAB_007ebd36;
      *puVar9 = 0;
    }
    bVar6 = TaggedInt::Is(pvVar4);
    if ((Var)0x3ffffffffffff < pvVar4 || bVar6) goto LAB_007ebc34;
    pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar4);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar6) goto LAB_007ebd36;
      *puVar9 = 0;
    }
    TVar2 = ((pRVar10->type).ptr)->typeId;
    if (0x57 < (int)TVar2) {
      BVar7 = RecyclableObject::IsExternal(pRVar10);
      if (BVar7 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar6) {
LAB_007ebd36:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar9 = 0;
      }
      goto LAB_007ebc34;
    }
    if (TVar2 != TypeIds_StringObject) goto LAB_007ebc34;
  }
  else {
    pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar4);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar6) goto LAB_007ebd36;
      *puVar9 = 0;
    }
    TVar2 = ((pRVar10->type).ptr)->typeId;
    if (0x57 < (int)TVar2) {
      BVar7 = RecyclableObject::IsExternal(pRVar10);
      if (BVar7 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar6) goto LAB_007ebd36;
        *puVar9 = 0;
      }
      goto LAB_007ebb4a;
    }
    if (TVar2 != TypeIds_String) goto LAB_007ebb4a;
  }
  checkWriteableFunction.flag._4_4_ = uVar1 | 0x400;
LAB_007ebc34:
  checkWriteableFunction.this = (RecyclableObjectDisplay *)((long)&checkWriteableFunction.flag + 4);
  scriptContext = this->scriptContext;
  __enterScriptObject.library = (JavascriptLibrary *)this;
  if (scriptContext->threadContext->isScriptActive == false) {
    __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
    __entryExitRecord.scriptContext = (ScriptContext *)0x0;
    __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
    __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
    __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
    auStack_a8 = (undefined1  [8])0x0;
    __entryExitRecord._0_1_ = 0;
    __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
    __entryExitRecord._2_6_ = 0;
    EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
               (ScriptEntryExitRecord *)auStack_a8,unaff_retaddr,&stack0x00000000,false,false,false)
    ;
    ScriptContext::OnScriptStart(scriptContext,false,true);
    EnterScriptObject::VerifyEnterScript
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
    GetTypeAttribute::anon_class_16_2_3fdfe927::operator()
              ((anon_class_16_2_3fdfe927 *)&__enterScriptObject.library);
    EnterScriptObject::~EnterScriptObject
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  }
  else {
    GetTypeAttribute::anon_class_16_2_3fdfe927::operator()
              ((anon_class_16_2_3fdfe927 *)&__enterScriptObject.library);
  }
  return checkWriteableFunction.flag._4_4_;
}

Assistant:

DBGPROP_ATTRIB_FLAGS RecyclableObjectDisplay::GetTypeAttribute()
    {
        DBGPROP_ATTRIB_FLAGS flag = defaultAttributes;

        if (Js::VarIs<Js::RecyclableObject>(instance))
        {
            if (instance == scriptContext->GetLibrary()->GetDebuggerDeadZoneBlockVariableString())
            {
                flag |= DBGPROP_ATTRIB_VALUE_IS_INVALID;
            }
            else if (JavascriptOperators::GetTypeId(instance) == TypeIds_Function)
            {
                flag |= DBGPROP_ATTRIB_VALUE_IS_METHOD;
            }
            else if (JavascriptOperators::GetTypeId(instance) == TypeIds_String
                || JavascriptOperators::GetTypeId(instance) == TypeIds_StringObject)
            {
                flag |= DBGPROP_ATTRIB_VALUE_IS_RAW_STRING;
            }
        }

        auto checkWriteableFunction = [&]()
        {
            if (pObjAddress && !pObjAddress->IsWritable())
            {
                flag |= DBGPROP_ATTRIB_VALUE_READONLY;
            }
        };

        if (!scriptContext->GetThreadContext()->IsScriptActive())
        {
            BEGIN_JS_RUNTIME_CALL_EX(scriptContext, false);
            {
                IGNORE_STACKWALK_EXCEPTION(scriptContext);
                checkWriteableFunction();
            }
            END_JS_RUNTIME_CALL(scriptContext);
        }
        else
        {
            checkWriteableFunction();
        }
        // TODO : need to identify Events explicitly for fastDOM

        return flag;
    }